

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operation.cpp
# Opt level: O2

ptr<Value> __thiscall Operation::asBooleans(Operation *this,bool leftOperand,bool rightOperand)

{
  ThrowPacket *this_00;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  allocator<char> local_49;
  undefined1 local_48 [48];
  
  this_00 = (ThrowPacket *)
            __cxa_allocate_exception
                      (0x10,CONCAT71(in_register_00000031,leftOperand),
                       CONCAT71(in_register_00000011,rightOperand));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_48 + 0x10),"Operation not defined for Boolean type",&local_49);
  ExceptionObjects::undefined_operation((string *)local_48);
  ThrowPacket::ThrowPacket(this_00,(ptr<Value> *)local_48);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> Operation::asBooleans(bool leftOperand, bool rightOperand) {
    throw ThrowPacket(ExceptionObjects::undefined_operation("Operation not defined for Boolean type"));
}